

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  ImDrawChannel *pIVar4;
  void *pvVar5;
  ImDrawChannel *pIVar6;
  void *pvVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  
  iVar2 = (this->_Channels).Size;
  if (iVar2 < channels_count) {
    if ((this->_Channels).Capacity < channels_count) {
      pIVar6 = (ImDrawChannel *)ImGui::MemAlloc((long)channels_count << 5);
      pIVar4 = (this->_Channels).Data;
      if (pIVar4 != (ImDrawChannel *)0x0) {
        memcpy(pIVar6,pIVar4,(long)(this->_Channels).Size << 5);
        ImGui::MemFree((this->_Channels).Data);
      }
      (this->_Channels).Data = pIVar6;
      (this->_Channels).Capacity = channels_count;
    }
    iVar3 = (this->_Channels).Capacity;
    if (iVar3 < channels_count) {
      if (iVar3 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar3 / 2 + iVar3;
      }
      if (iVar11 <= channels_count) {
        iVar11 = channels_count;
      }
      if (iVar3 < iVar11) {
        pIVar6 = (ImDrawChannel *)ImGui::MemAlloc((long)iVar11 << 5);
        pIVar4 = (this->_Channels).Data;
        if (pIVar4 != (ImDrawChannel *)0x0) {
          memcpy(pIVar6,pIVar4,(long)(this->_Channels).Size << 5);
          ImGui::MemFree((this->_Channels).Data);
        }
        (this->_Channels).Data = pIVar6;
        (this->_Channels).Capacity = iVar11;
      }
    }
    (this->_Channels).Size = channels_count;
  }
  this->_Count = channels_count;
  pIVar4 = (this->_Channels).Data;
  (pIVar4->_IdxBuffer).Size = 0;
  (pIVar4->_IdxBuffer).Capacity = 0;
  (pIVar4->_IdxBuffer).Data = (uint *)0x0;
  (pIVar4->_CmdBuffer).Size = 0;
  (pIVar4->_CmdBuffer).Capacity = 0;
  (pIVar4->_CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar10 = 1;
    lVar9 = 0x38;
    do {
      pIVar4 = (this->_Channels).Data;
      puVar1 = (undefined8 *)((long)&(pIVar4->_CmdBuffer).Size + lVar9);
      if ((long)uVar10 < (long)iVar2) {
        iVar3 = *(int *)((long)pIVar4 + lVar9 + -0x14);
        if (iVar3 < 0) {
          uVar8 = iVar3 / 2 + iVar3;
          if ((int)uVar8 < 1) {
            uVar8 = 0;
          }
          pvVar7 = ImGui::MemAlloc((ulong)uVar8 * 0x38);
          pvVar5 = *(void **)((long)pIVar4 + lVar9 + -0x10);
          if (pvVar5 != (void *)0x0) {
            memcpy(pvVar7,pvVar5,(long)*(int *)((long)pIVar4 + lVar9 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar4 + lVar9 + -0x10));
          }
          *(void **)((long)pIVar4 + lVar9 + -0x10) = pvVar7;
          *(uint *)((long)pIVar4 + lVar9 + -0x14) = uVar8;
        }
        *(undefined4 *)(puVar1 + -3) = 0;
        pIVar4 = (this->_Channels).Data;
        iVar3 = *(int *)((long)pIVar4 + lVar9 + -4);
        if (iVar3 < 0) {
          uVar8 = iVar3 / 2 + iVar3;
          if ((int)uVar8 < 1) {
            uVar8 = 0;
          }
          pvVar7 = ImGui::MemAlloc((ulong)uVar8 * 4);
          pvVar5 = *(void **)((long)&(pIVar4->_CmdBuffer).Size + lVar9);
          if (pvVar5 != (void *)0x0) {
            memcpy(pvVar7,pvVar5,(long)*(int *)((long)pIVar4 + lVar9 + -8) << 2);
            ImGui::MemFree(*(void **)((long)&(pIVar4->_CmdBuffer).Size + lVar9));
          }
          *(void **)((long)&(pIVar4->_CmdBuffer).Size + lVar9) = pvVar7;
          *(uint *)((long)pIVar4 + lVar9 + -4) = uVar8;
        }
        *(undefined4 *)((long)pIVar4 + lVar9 + -8) = 0;
      }
      else {
        puVar1[-1] = 0;
        *puVar1 = 0;
        puVar1[-3] = 0;
        puVar1[-2] = 0;
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x20;
    } while ((uint)channels_count != uVar10);
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_UNUSED(draw_list);
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
    {
        _Channels.reserve(channels_count); // Avoid over reserving since this is likely to stay stable
        _Channels.resize(channels_count);
    }
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
    }
}